

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O0

void __thiscall
DCACHE::dc_simulate_write
          (DCACHE *this,oraddr_t dataaddr,oraddr_t virt_addr,uint32_t data,int width,int data_ci)

{
  uint uVar1;
  oraddr_t oVar2;
  uint32_t uVar3;
  BUS_DEVICE *pBVar4;
  sbyte sVar5;
  sbyte sVar6;
  int iVar7;
  uint32_t local_48;
  int minway;
  int minlru;
  BUS_DEVICE *device;
  uint32_t tmp;
  oraddr_t tagaddr;
  int i;
  int way;
  int set;
  int data_ci_local;
  int width_local;
  uint32_t data_local;
  oraddr_t virt_addr_local;
  oraddr_t dataaddr_local;
  DCACHE *this_local;
  
  tagaddr = 0xffffffff;
  pBVar4 = BUS::get_device((this->super_CACHE).bus_p,dataaddr);
  if (width == 4) {
    (*pBVar4->_vptr_BUS_DEVICE[5])(pBVar4,(ulong)dataaddr,(ulong)virt_addr,(ulong)data);
  }
  else if (width == 2) {
    (*pBVar4->_vptr_BUS_DEVICE[4])(pBVar4,(ulong)dataaddr,(ulong)virt_addr,(ulong)(ushort)data);
  }
  else if (width == 1) {
    (*pBVar4->_vptr_BUS_DEVICE[3])(pBVar4,(ulong)dataaddr,(ulong)virt_addr,(ulong)(byte)data);
  }
  if ((((((this->super_CACHE).cpu)->sprs[1] & 2) != 0) &&
      ((((this->super_CACHE).cpu)->sprs[0x11] & 8) != 0)) && (data_ci == 0)) {
    iVar7 = (int)(((ulong)dataaddr / (ulong)(this->super_CACHE).blocksize) %
                 (ulong)(this->super_CACHE).nsets);
    oVar2 = (oraddr_t)
            (((ulong)dataaddr / (ulong)(this->super_CACHE).blocksize) /
            (ulong)(this->super_CACHE).nsets);
    for (tmp = 0; tmp < (this->super_CACHE).nways; tmp = tmp + 1) {
      if (this->cache_mem[(int)tmp].cache_set[iVar7].tagaddr == oVar2) {
        tagaddr = tmp;
      }
    }
    if ((int)tagaddr < 0) {
      local_48 = 0;
      for (tmp = 0; tmp < (this->super_CACHE).nways; tmp = tmp + 1) {
        if (this->cache_mem[(int)tmp].cache_set[iVar7].lru < (int)((this->super_CACHE).ustates - 1))
        {
          local_48 = tmp;
        }
      }
      for (tmp = 0; tmp < (this->super_CACHE).blocksize; tmp = tmp + 4) {
        pBVar4 = BUS::get_device((this->super_CACHE).bus_p,
                                 (dataaddr & ((this->super_CACHE).blocksize - 1 ^ 0xffffffff)) +
                                 ((dataaddr & 0xfffffffc) + tmp & (this->super_CACHE).blocksize - 1)
                                );
        uVar3 = (*pBVar4->_vptr_BUS_DEVICE[2])
                          (pBVar4,(ulong)((dataaddr &
                                          ((this->super_CACHE).blocksize - 1 ^ 0xffffffff)) +
                                         ((dataaddr & 0xfffffffc) + tmp &
                                         (this->super_CACHE).blocksize - 1)),0);
        this->cache_mem[(int)local_48].cache_set[iVar7].line
        [(dataaddr + tmp & (this->super_CACHE).blocksize - 1) >> 2] = uVar3;
      }
      this->cache_mem[(int)local_48].cache_set[iVar7].tagaddr = oVar2;
      for (tmp = 0; tmp < (this->super_CACHE).nways; tmp = tmp + 1) {
        if (this->cache_mem[(int)tmp].cache_set[iVar7].lru != 0) {
          this->cache_mem[(int)tmp].cache_set[iVar7].lru =
               this->cache_mem[(int)tmp].cache_set[iVar7].lru + -1;
        }
      }
      this->cache_mem[(int)local_48].cache_set[iVar7].lru = (this->super_CACHE).ustates - 1;
    }
    else {
      for (tmp = 0; tmp < (this->super_CACHE).nways; tmp = tmp + 1) {
        if (this->cache_mem[(int)tagaddr].cache_set[iVar7].lru <
            this->cache_mem[(int)tmp].cache_set[iVar7].lru) {
          this->cache_mem[(int)tmp].cache_set[iVar7].lru =
               this->cache_mem[(int)tmp].cache_set[iVar7].lru + -1;
        }
      }
      this->cache_mem[(int)tagaddr].cache_set[iVar7].lru = (this->super_CACHE).ustates - 1;
      uVar1 = this->cache_mem[(int)tagaddr].cache_set[iVar7].line
              [(dataaddr & (this->super_CACHE).blocksize - 1) >> 2];
      device._0_4_ = data;
      if (width != 4) {
        if (width == 2) {
          sVar5 = 0;
          if ((dataaddr & 2) != 0) {
            sVar5 = 0x10;
          }
          sVar6 = 0x10;
          if ((dataaddr & 2) != 0) {
            sVar6 = 0;
          }
          device._0_4_ = (data & 0xffff) << sVar6 | 0xffff << sVar5 & uVar1;
        }
        else {
          device._0_4_ = uVar1;
          if (width == 1) {
            device._0_4_ = (data & 0xff) << (('\x03' - ((byte)dataaddr & 3)) * '\b' & 0x1f) |
                           (0xff << (('\x03' - ((byte)dataaddr & 3)) * '\b' & 0x1f) ^ 0xffffffffU) &
                           uVar1;
          }
        }
      }
      this->cache_mem[(int)tagaddr].cache_set[iVar7].line
      [(dataaddr & (this->super_CACHE).blocksize - 1) >> 2] = (uint32_t)device;
    }
  }
  return;
}

Assistant:

void DCACHE::dc_simulate_write(oraddr_t dataaddr, oraddr_t virt_addr, uint32_t data, int width, int data_ci)
{
    int set, way = -1;
    int i;
    oraddr_t tagaddr;
    uint32_t tmp;
    BUS_DEVICE * device;
    device = bus_p->get_device(dataaddr);

    if (width == 4)
        device->Write32(dataaddr, virt_addr, data);
    else if (width == 2)
        device->Write16(dataaddr, virt_addr, data);
    else if (width == 1)
        device->Write8(dataaddr, virt_addr, data);

    if (!(cpu->sprs[SPR_UPR] & SPR_UPR_DCP) ||
        !(cpu->sprs[SPR_SR] & SPR_SR_DCE) || data_ci)
        return;

    /* Which set to check out? */
    set = (dataaddr / blocksize) % nsets;
    tagaddr = (dataaddr / blocksize) / nsets;

    /* Scan all ways and try to find a matching way. */
    for (i = 0; i < nways; i++)
        if (cache_mem[i].cache_set[set].tagaddr == tagaddr)
            way = i;
    
    /* Did we find our cached data? */
    if (way >= 0)
    { /* Yes, we did. */
        // dc_stats.writehit++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru > cache_mem[way].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[way].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_hitdelay;

        tmp =
            cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2];
        if (width == 4)
            tmp = data;
        else if (width == 2)
        {
            tmp &= 0xffff << ((dataaddr & 2) ? 16 : 0);
            tmp |= (data & 0xffff) << ((dataaddr & 2) ? 0 : 16);
        }
        else if (width == 1)
        {
            tmp &= ~(0xff << (8 * (3 - (dataaddr & 3))));
            tmp |= (data & 0xff) << (8 * (3 - (dataaddr & 3)));
        }
        cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2] =
            tmp;
    }
    else
    { /* No, we didn't. */
        int minlru = ustates - 1;
        int minway = 0;

        // dc_stats.writemiss++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru < minlru)
                minway = i;

        for (i = 0; i < (blocksize); i += 4)
        {
            device = bus_p->get_device((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)));
            cache_mem[minway].cache_set[set].line[((dataaddr + i) & (blocksize - 1)) >> 2] =
                /* FIXME: Same comment as in dc_simulate_read */
                device->Read32((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)), 0);

        }

        cache_mem[minway].cache_set[set].tagaddr = tagaddr;
        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[minway].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_missdelay;

        // if (config.pcu.enabled)
        //     pcu_count_event(SPR_PCMR_DCM);
    }
}